

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_Error sfnt_init_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  byte *pbVar1;
  FT_Library library;
  ulong uVar2;
  ulong uVar3;
  size_t input_len;
  byte bVar4;
  ulong *puVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  ushort uVar8;
  int iVar9;
  FT_Error FVar10;
  FT_Pointer pvVar11;
  FT_Module pFVar12;
  FT_ULong FVar13;
  FT_ULong FVar14;
  FT_Byte *base;
  ulong *puVar15;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  FT_ULong *pFVar16;
  TTC_HeaderRec *P;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  FT_Driver module;
  FT_Stream pFVar22;
  ulong uVar23;
  ulong uVar24;
  FT_Byte *pFVar25;
  long lVar26;
  FT_Memory pFVar27;
  FT_Memory P_00;
  undefined8 *puVar28;
  uint uVar29;
  FT_Stream pFVar30;
  long lVar31;
  FT_Error local_f8;
  uint local_f4;
  FT_Stream local_f0;
  FT_Error local_e4;
  ulong *local_e0;
  FT_Memory local_d8;
  ulong local_d0;
  FT_Memory local_c8;
  TTC_HeaderRec *local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined8 *local_a8;
  ulong local_a0;
  uint local_94;
  WOFF_HeaderRec woff;
  
  module = (face->root).driver;
  library = (module->root).library;
  local_a8 = (undefined8 *)face->sfnt;
  if (local_a8 == (undefined8 *)0x0) {
    local_a8 = (undefined8 *)FT_Get_Module_Interface(library,"sfnt");
    if (local_a8 == (undefined8 *)0x0) {
      return 0xb;
    }
    face->sfnt = local_a8;
    face->goto_table = (TT_Loader_GotoTableFunc)*local_a8;
    module = (face->root).driver;
  }
  pvVar11 = ft_module_get_service(&module->root,"postscript-cmaps",'\x01');
  face->psnames = pvVar11;
  if (face->mm == (void *)0x0) {
    pFVar12 = FT_Get_Module(library,"truetype");
    pvVar11 = ft_module_get_service(pFVar12,"multi-masters",'\0');
    face->mm = pvVar11;
  }
  if (face->var == (void *)0x0) {
    pFVar12 = FT_Get_Module(library,"truetype");
    pvVar11 = ft_module_get_service(pFVar12,"metrics-variations",'\0');
    face->var = pvVar11;
  }
  local_c8 = stream->memory;
  local_c0 = &face->ttc_header;
  (face->ttc_header).count = 0;
  (face->ttc_header).tag = 0;
  (face->ttc_header).version = 0;
LAB_0015951a:
  FVar13 = FT_Stream_Pos(stream);
  FVar14 = FT_Stream_ReadULong(stream,&local_e4);
  if (local_e4 != 0) {
    return local_e4;
  }
  if (FVar14 == 0x774f4646) {
    local_e4 = FT_Stream_Seek(stream,FVar13);
    if (local_e4 != 0) {
      return local_e4;
    }
    pFVar27 = stream->memory;
    local_f8 = FT_Stream_ReadFields
                         (stream,(FT_Frame_Field *)woff_open_font_woff_header_fields,&woff);
    if (local_f8 != 0) {
      return local_f8;
    }
    lVar31 = CONCAT44(woff.flavor._4_4_,
                      CONCAT13(woff.flavor._3_1_,
                               CONCAT12(woff.flavor._2_1_,
                                        CONCAT11(woff.flavor._1_1_,(FT_Byte)woff.flavor))));
    if ((((((lVar31 == 0x74746366) || (lVar31 == 0x774f4646)) || (woff.length != stream->size)) ||
         ((woff.num_tables == 0 || (woff.length <= (ulong)woff.num_tables * 0x14 + 0x2c)))) ||
        (uVar21 = (ulong)woff.num_tables << 4 | 0xc, woff.totalSfntSize <= uVar21)) ||
       ((woff.totalSfntSize & 3) != 0)) {
      return 8;
    }
    if (woff.metaOffset == 0) {
      if (woff.metaLength != 0 || woff.metaOrigLength != 0) {
        return 8;
      }
    }
    else if ((woff.metaLength != 0) && (woff.metaOrigLength == 0)) {
      return 8;
    }
    if ((woff.privOffset == 0) && (woff.privLength != 0)) {
      return 8;
    }
    base = (FT_Byte *)ft_mem_alloc(pFVar27,uVar21,&local_f8);
    if (local_f8 == 0) {
      local_f0 = (FT_Stream)ft_mem_alloc(pFVar27,0x50,&local_f8);
      if (local_f8 == 0) {
        iVar17 = -1;
        for (uVar18 = (uint)woff.num_tables; uVar18 != 0; uVar18 = uVar18 >> 1) {
          iVar17 = iVar17 + 1;
        }
        bVar4 = (byte)iVar17 & 0x1f;
        iVar19 = 0x10 << bVar4;
        iVar9 = (uint)woff.num_tables * 0x10 - iVar19;
        *base = woff.flavor._3_1_;
        base[1] = woff.flavor._2_1_;
        base[2] = woff.flavor._1_1_;
        base[3] = (FT_Byte)woff.flavor;
        base[4] = woff.num_tables._1_1_;
        base[5] = (FT_Byte)woff.num_tables;
        base[6] = (FT_Byte)((uint)iVar19 >> 8);
        base[7] = (FT_Byte)iVar19;
        base[8] = (FT_Byte)((uint)iVar17 >> 8);
        base[9] = (byte)iVar17;
        base[10] = (FT_Byte)((uint)iVar9 >> 8);
        base[0xb] = (FT_Byte)iVar9;
        puVar15 = (ulong *)ft_mem_realloc(pFVar27,0x30,(ulong)(uint)(0 << bVar4),
                                          (ulong)woff.num_tables,(void *)0x0,&local_f8);
        if (local_f8 == 0) {
          local_e0 = puVar15;
          local_d8 = (FT_Memory)
                     ft_mem_realloc(pFVar27,8,0,(ulong)woff.num_tables,(void *)0x0,&local_f8);
          puVar15 = local_e0;
          P_00 = local_d8;
          pFVar30 = local_f0;
          if ((local_f8 == 0) &&
             (local_f8 = FT_Stream_EnterFrame(stream,(ulong)woff.num_tables * 0x14),
             puVar15 = local_e0, P_00 = local_d8, pFVar30 = local_f0, local_f8 == 0)) {
            uVar21 = 0;
            local_f4 = face_instance_index;
            for (uVar24 = 0; uVar24 < woff.num_tables; uVar24 = uVar24 + 1) {
              local_b8 = uVar21;
              FVar13 = FT_Stream_GetULong(stream);
              *puVar15 = FVar13;
              FVar13 = FT_Stream_GetULong(stream);
              puVar15[1] = FVar13;
              FVar13 = FT_Stream_GetULong(stream);
              puVar15[2] = FVar13;
              FVar13 = FT_Stream_GetULong(stream);
              puVar15[3] = FVar13;
              FVar13 = FT_Stream_GetULong(stream);
              puVar15[4] = FVar13;
              uVar21 = *puVar15;
              if (uVar21 <= local_b8) {
                FT_Stream_ExitFrame(stream);
                goto LAB_00159916;
              }
              *(ulong **)((long)local_d8 + uVar24 * 8) = puVar15;
              puVar15 = puVar15 + 6;
            }
            FT_Stream_ExitFrame(stream);
            qsort(local_d8,(ulong)woff.num_tables,8,compare_offsets);
            face_instance_index = local_f4;
            uVar24 = (ulong)woff.num_tables * 0x14 + 0x2c;
            local_b8 = (ulong)woff.num_tables << 4 | 0xc;
            uVar21 = local_b8;
            for (uVar23 = 0; woff.num_tables != uVar23; uVar23 = uVar23 + 1) {
              lVar31 = *(long *)((long)local_d8 + uVar23 * 8);
              if (*(ulong *)(lVar31 + 8) != uVar24) goto LAB_00159916;
              uVar2 = *(ulong *)(lVar31 + 0x10);
              if ((woff.length < uVar2) || (woff.length - uVar2 < uVar24)) goto LAB_00159916;
              uVar3 = *(ulong *)(lVar31 + 0x18);
              if ((uVar3 < uVar2) ||
                 ((woff.totalSfntSize < uVar3 || (woff.totalSfntSize - uVar3 < uVar21))))
              goto LAB_00159916;
              *(ulong *)(lVar31 + 0x28) = uVar21;
              uVar24 = uVar24 + ((int)uVar2 + 3U & 0xfffffffc);
              uVar21 = uVar21 + ((int)uVar3 + 3U & 0xfffffffc);
            }
            if ((((woff.metaOffset == 0) ||
                 ((woff.metaOffset == uVar24 &&
                  (uVar24 = uVar24 + woff.metaLength, uVar24 <= woff.length)))) &&
                ((woff.privOffset == 0 ||
                 ((woff.privOffset == ((int)uVar24 + 3U & 0xfffffffc) &&
                  (uVar24 = woff.privOffset + woff.privLength, uVar24 <= woff.length)))))) &&
               ((uVar21 == woff.totalSfntSize && (uVar24 == woff.length)))) {
              base = (FT_Byte *)ft_mem_realloc(pFVar27,1,local_b8,woff.totalSfntSize,base,&local_f8)
              ;
              puVar15 = local_e0;
              P_00 = local_d8;
              pFVar30 = local_f0;
              if (local_f8 == 0) {
                pFVar25 = base + 0xc;
                uVar21 = 0;
                while (pFVar30 = local_f0, uVar21 < woff.num_tables) {
                  lVar31 = uVar21 * 0x30;
                  *pFVar25 = *(FT_Byte *)((long)local_e0 + lVar31 + 3);
                  pFVar25[1] = *(FT_Byte *)((long)local_e0 + lVar31 + 2);
                  pFVar25[2] = *(FT_Byte *)((long)local_e0 + lVar31 + 1);
                  pFVar25[3] = (FT_Byte)local_e0[uVar21 * 6];
                  pFVar25[4] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x23);
                  pFVar25[5] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x22);
                  pFVar25[6] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x21);
                  pFVar25[7] = (FT_Byte)local_e0[uVar21 * 6 + 4];
                  pFVar25[8] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x2b);
                  pFVar25[9] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x2a);
                  pFVar25[10] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x29);
                  pFVar25[0xb] = (FT_Byte)local_e0[uVar21 * 6 + 5];
                  pFVar25[0xc] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x1b);
                  pFVar25[0xd] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x1a);
                  pFVar25[0xe] = *(FT_Byte *)((long)local_e0 + lVar31 + 0x19);
                  pFVar25[0xf] = (FT_Byte)local_e0[uVar21 * 6 + 3];
                  local_b8 = uVar21;
                  local_f8 = FT_Stream_Seek(stream,local_e0[uVar21 * 6 + 1]);
                  puVar5 = local_e0;
                  puVar15 = local_e0;
                  P_00 = local_d8;
                  pFVar30 = local_f0;
                  face_instance_index = local_f4;
                  if ((local_f8 != 0) ||
                     (local_f8 = FT_Stream_EnterFrame(stream,local_e0[uVar21 * 6 + 2]),
                     puVar15 = local_e0, P_00 = local_d8, pFVar30 = local_f0,
                     face_instance_index = local_f4, local_f8 != 0)) goto LAB_00159729;
                  input_len = puVar5[uVar21 * 6 + 2];
                  if (input_len == puVar5[uVar21 * 6 + 3]) {
                    memcpy(base + puVar5[uVar21 * 6 + 5],stream->cursor,input_len);
                  }
                  else {
                    local_d0 = puVar5[uVar21 * 6 + 3];
                    local_f8 = FT_Gzip_Uncompress(pFVar27,base + puVar5[uVar21 * 6 + 5],&local_d0,
                                                  stream->cursor,input_len);
                    puVar15 = local_e0;
                    P_00 = local_d8;
                    pFVar30 = local_f0;
                    face_instance_index = local_f4;
                    if (local_f8 != 0) goto LAB_00159729;
                    if (local_d0 != puVar5[uVar21 * 6 + 3]) goto LAB_00159916;
                  }
                  pFVar25 = pFVar25 + 0x10;
                  FT_Stream_ExitFrame(stream);
                  for (uVar21 = puVar5[uVar21 * 6 + 3] + puVar5[uVar21 * 6 + 5]; (uVar21 & 3) != 0;
                      uVar21 = uVar21 + 1) {
                    base[uVar21] = '\0';
                  }
                  uVar21 = local_b8 + 1;
                }
                FT_Stream_OpenMemory(local_f0,base,woff.totalSfntSize);
                pFVar30->memory = stream->memory;
                pFVar30->close = sfnt_stream_close;
                FT_Stream_Free((face->root).stream,(uint)(face->root).face_flags >> 10 & 1);
                (face->root).stream = pFVar30;
                pbVar1 = (byte *)((long)&(face->root).face_flags + 1);
                *pbVar1 = *pbVar1 & 0xfb;
                puVar15 = local_e0;
                P_00 = local_d8;
                face_instance_index = local_f4;
              }
            }
            else {
              local_f8 = 8;
              puVar15 = local_e0;
              P_00 = local_d8;
              pFVar30 = local_f0;
            }
          }
          goto LAB_00159729;
        }
      }
      else {
        puVar15 = (ulong *)0x0;
      }
      P_00 = (FT_Memory)(void *)0x0;
      pFVar30 = local_f0;
    }
    else {
      puVar15 = (ulong *)0x0;
      P_00 = (FT_Memory)(void *)0x0;
      pFVar30 = (FT_Stream)0x0;
    }
    goto LAB_00159729;
  }
  if ((((FVar14 != 0x10000) && (FVar14 != 0x20000)) && (FVar14 != 0x4f54544f)) &&
     (((FVar14 != 0x74727565 && (FVar14 != 0x74746366)) &&
      ((FVar14 != 0x74797031 && ((FVar14 != 0xa56b6264 && (FVar14 != 0xa56c7374)))))))) {
    return 2;
  }
  local_c0->tag = 0x74746366;
  if (FVar14 == 0x74746366) {
    local_e4 = FT_Stream_ReadFields
                         (stream,(FT_Frame_Field *)sfnt_open_font_ttc_header_fields,local_c0);
    if (local_e4 != 0) {
      return local_e4;
    }
    uVar21 = (face->ttc_header).count;
    if (uVar21 == 0) {
      return 8;
    }
    if (stream->size >> 5 < uVar21) {
      return 10;
    }
    pFVar16 = (FT_ULong *)ft_mem_realloc(local_c8,8,0,uVar21,(void *)0x0,&local_e4);
    (face->ttc_header).offsets = pFVar16;
    if (local_e4 != 0) {
      return local_e4;
    }
    FVar10 = FT_Stream_EnterFrame(stream,(face->ttc_header).count << 2);
    if (FVar10 != 0) {
      return FVar10;
    }
    local_e4 = 0;
    for (lVar31 = 0; lVar31 < (face->ttc_header).count; lVar31 = lVar31 + 1) {
      FVar13 = FT_Stream_GetULong(stream);
      (face->ttc_header).offsets[lVar31] = FVar13;
    }
    FT_Stream_ExitFrame(stream);
    if (local_e4 != 0) {
      return local_e4;
    }
  }
  else {
    (face->ttc_header).version = 0x10000;
    (face->ttc_header).count = 1;
    pFVar16 = (FT_ULong *)ft_mem_alloc(local_c8,8,&local_e4);
    (face->ttc_header).offsets = pFVar16;
    if (local_e4 != 0) {
      return local_e4;
    }
    *pFVar16 = FVar13;
  }
  pFVar30 = (face->root).stream;
  uVar18 = -face_instance_index;
  if (0 < face_instance_index) {
    uVar18 = face_instance_index;
  }
  iVar17 = (face_instance_index >> 0x1f) + (uVar18 & 0xffff);
  if ((face->ttc_header).count <= (long)iVar17) {
    if (-1 < face_instance_index) {
      return 6;
    }
    iVar17 = 0;
  }
  FVar10 = FT_Stream_Seek(pFVar30,(face->ttc_header).offsets[iVar17]);
  if (FVar10 != 0) {
    return FVar10;
  }
  iVar17 = (*(code *)local_a8[0x16])(face,pFVar30);
  if (iVar17 != 0) {
    return iVar17;
  }
  local_d8 = (face->root).memory;
  local_f4 = face_instance_index;
  local_d0._0_4_ = iVar17;
  FVar10 = (*face->goto_table)(face,0x66766172,pFVar30,&woff.signature);
  if (((FVar10 == 0) && (0x13 < woff.signature)) &&
     (FVar13 = FT_Stream_ReadULong(pFVar30,(FT_Error *)&local_d0), (int)local_d0 == 0)) {
    FVar6 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d0);
    local_c0 = (TTC_HeaderRec *)CONCAT62(local_c0._2_6_,FVar6);
    if ((((int)local_d0 != 0) || (local_d0._0_4_ = FT_Stream_Skip(pFVar30,2), (int)local_d0 != 0))
       || (FVar6 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d0), (int)local_d0 != 0))
    goto LAB_00159e0a;
    FVar7 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d0);
    local_f0 = (FT_Stream)CONCAT62(extraout_var,FVar7);
    if ((int)local_d0 != 0) goto LAB_00159e0a;
    FVar7 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d0);
    local_c8 = (FT_Memory)CONCAT62(extraout_var_00,FVar7);
    if (((int)local_d0 != 0) ||
       (uVar8 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d0), (int)local_d0 != 0))
    goto LAB_00159e0a;
    uVar21 = (ulong)local_c0 & 0xffff;
    pFVar22 = local_f0;
  }
  else {
LAB_00159e0a:
    FVar13 = 0;
    uVar21 = 0;
    FVar6 = 0;
    local_c8 = (FT_Memory)0x0;
    uVar8 = 0;
    pFVar22 = (FT_Stream)0x0;
  }
  pFVar27 = local_d8;
  uVar20 = (uint)FVar6;
  if ((ushort)(FVar6 + 0xc001) < 0xc002 || ((short)pFVar22 != 0x14 || FVar13 != 0x10000)) {
LAB_00159e52:
    local_c8 = (FT_Memory)0x0;
  }
  else {
    if (uVar20 * 4 + 4 != (uint)uVar8) {
      if ((ushort)local_c8 < 0x7f00 && uVar20 * 4 + 6 == (uint)uVar8) goto LAB_00159fab;
      goto LAB_00159e52;
    }
    if (0x7eff < (ushort)local_c8) goto LAB_00159e52;
LAB_00159fab:
    if (woff.signature < (ulong)(((uint)local_c8 & 0xffff) * (uint)uVar8) + uVar20 * 0x14 + uVar21)
    goto LAB_00159e52;
    *(byte *)&face->variation_support = (byte)face->variation_support | 1;
  }
  if ((face->variation_support & 1) == 0) {
    P = (TTC_HeaderRec *)0x0;
    puVar15 = (ulong *)0x0;
  }
  else {
    puVar28 = (undefined8 *)(ulong)(uVar20 * 4);
    local_f0 = pFVar22;
    local_b8 = (ulong)uVar8;
    local_b0 = (ulong)FVar6;
    local_a0 = uVar21;
    P = (TTC_HeaderRec *)ft_mem_alloc(local_d8,(FT_Long)puVar28,(FT_Error *)&local_d0);
    if ((int)local_d0 == 0) {
      local_c0 = P;
      puVar15 = (ulong *)ft_mem_alloc(pFVar27,(FT_Long)puVar28,(FT_Error *)&local_d0);
      P = local_c0;
      pFVar27 = local_d8;
      local_e0 = puVar15;
      if ((int)local_d0 == 0) {
        uVar21 = (ulong)local_f0 & 0xffff;
        local_a8 = puVar28;
        FVar13 = FT_Stream_Pos(pFVar30);
        lVar31 = local_a0 + FVar13;
        FVar13 = (local_a0 - 8) + FVar13;
        local_f0 = (FT_Stream)uVar21;
        local_a0 = uVar21;
        for (lVar26 = 0; puVar28 = local_a8, puVar15 = local_e0, (int)local_a8 != (int)lVar26;
            lVar26 = lVar26 + 4) {
          local_d0._0_4_ =
               FT_Stream_ReadAt(pFVar30,FVar13,(FT_Byte *)((long)&local_c0->tag + lVar26),4);
          FVar13 = FVar13 + (long)local_f0;
        }
        FVar13 = ((ulong)((int)local_a0 * (uint)local_b0) + lVar31) - 0xc;
        local_b0 = CONCAT44(local_b0._4_4_,(uint)(ushort)local_c8);
        uVar20 = (uint)(ushort)local_c8;
        local_f0 = pFVar30;
        local_94 = uVar18;
        for (uVar29 = 0; uVar18 = uVar20, uVar20 != uVar29; uVar29 = uVar29 + 1) {
          local_d0._0_4_ = FT_Stream_ReadAt(local_f0,FVar13,(FT_Byte *)puVar15,(FT_ULong)puVar28);
          iVar17 = bcmp(local_c0,puVar15,(size_t)puVar28);
          uVar20 = (uint)local_b0;
          uVar18 = uVar29;
          if (iVar17 == 0) break;
          FVar13 = FVar13 + local_b8;
        }
        local_c8 = (FT_Memory)(ulong)((int)local_c8 + (uint)(uVar18 == uVar20));
        P = local_c0;
        pFVar27 = local_d8;
        puVar15 = local_e0;
        pFVar30 = local_f0;
        uVar18 = local_94;
      }
    }
    else {
      puVar15 = (ulong *)0x0;
    }
  }
  ft_mem_free(pFVar27,P);
  ft_mem_free(pFVar27,puVar15);
  FVar10 = (*face->goto_table)(face,0x676c7966,pFVar30,(FT_ULong *)0x0);
  if ((FVar10 == 0) ||
     (FVar10 = (*face->goto_table)(face,0x43464632,pFVar30,(FT_ULong *)0x0), FVar10 == 0)) {
    uVar20 = (uint)local_c8;
  }
  else {
    FVar10 = (*face->goto_table)(face,0x43464620,pFVar30,(FT_ULong *)0x0);
    uVar20 = (uint)local_c8;
    if (FVar10 == 0) {
      uVar20 = 0;
    }
  }
  if ((uVar20 & 0xffff) < uVar18 >> 0x10) {
    if (-1 < (int)local_f4) {
      return 6;
    }
    uVar20 = 0;
  }
  (face->root).style_flags = (ulong)(uVar20 << 0x10);
  (face->root).num_faces = (face->ttc_header).count;
  (face->root).face_index = (long)(int)local_f4;
  return (int)local_d0;
LAB_00159916:
  local_f8 = 8;
  puVar15 = local_e0;
  P_00 = local_d8;
  pFVar30 = local_f0;
  face_instance_index = local_f4;
LAB_00159729:
  ft_mem_free(pFVar27,puVar15);
  ft_mem_free(pFVar27,P_00);
  if (local_f8 == 0) {
    local_e4 = 0;
  }
  else {
    ft_mem_free(pFVar27,base);
    FT_Stream_Close(pFVar30);
    ft_mem_free(pFVar27,pFVar30);
    local_e4 = local_f8;
    if (local_f8 != 0) {
      return local_f8;
    }
  }
  stream = (face->root).stream;
  goto LAB_0015951a;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_init_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
    FT_Library    library = face->root.driver->root.library;
    SFNT_Service  sfnt;
    FT_Int        face_index;


    /* for now, parameters are unused */
    FT_UNUSED( num_params );
    FT_UNUSED( params );


    sfnt = (SFNT_Service)face->sfnt;
    if ( !sfnt )
    {
      sfnt = (SFNT_Service)FT_Get_Module_Interface( library, "sfnt" );
      if ( !sfnt )
      {
        FT_ERROR(( "sfnt_init_face: cannot access `sfnt' module\n" ));
        return FT_THROW( Missing_Module );
      }

      face->sfnt       = sfnt;
      face->goto_table = sfnt->goto_table;
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, face->psnames, POSTSCRIPT_CMAPS );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( !face->mm )
    {
      /* we want the MM interface from the `truetype' module only */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->mm = ft_module_get_service( tt_module,
                                        FT_SERVICE_ID_MULTI_MASTERS,
                                        0 );
    }

    if ( !face->var )
    {
      /* we want the metrics variations interface */
      /* from the `truetype' module only          */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->var = ft_module_get_service( tt_module,
                                         FT_SERVICE_ID_METRICS_VARIATIONS,
                                         0 );
    }
#endif

    FT_TRACE2(( "SFNT driver\n" ));

    error = sfnt_open_font( stream, face );
    if ( error )
      return error;

    /* Stream may have changed in sfnt_open_font. */
    stream = face->root.stream;

    FT_TRACE2(( "sfnt_init_face: %08p, %d\n", face, face_instance_index ));

    face_index = FT_ABS( face_instance_index ) & 0xFFFF;

    /* value -(N+1) requests information on index N */
    if ( face_instance_index < 0 )
      face_index--;

    if ( face_index >= face->ttc_header.count )
    {
      if ( face_instance_index >= 0 )
        return FT_THROW( Invalid_Argument );
      else
        face_index = 0;
    }

    if ( FT_STREAM_SEEK( face->ttc_header.offsets[face_index] ) )
      return error;

    /* check whether we have a valid TrueType file */
    error = sfnt->load_font_dir( face, stream );
    if ( error )
      return error;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    {
      FT_Memory  memory = face->root.memory;

      FT_ULong  fvar_len;

      FT_ULong  version;
      FT_ULong  offset;

      FT_UShort  num_axes;
      FT_UShort  axis_size;
      FT_UShort  num_instances;
      FT_UShort  instance_size;

      FT_Int  instance_index;

      FT_Byte*  default_values  = NULL;
      FT_Byte*  instance_values = NULL;


      instance_index = FT_ABS( face_instance_index ) >> 16;

      /* test whether current face is a GX font with named instances */
      if ( face->goto_table( face, TTAG_fvar, stream, &fvar_len ) ||
           fvar_len < 20                                          ||
           FT_READ_ULONG( version )                               ||
           FT_READ_USHORT( offset )                               ||
           FT_STREAM_SKIP( 2 ) /* reserved */                     ||
           FT_READ_USHORT( num_axes )                             ||
           FT_READ_USHORT( axis_size )                            ||
           FT_READ_USHORT( num_instances )                        ||
           FT_READ_USHORT( instance_size )                        )
      {
        version       = 0;
        offset        = 0;
        num_axes      = 0;
        axis_size     = 0;
        num_instances = 0;
        instance_size = 0;
      }

      /* check that the data is bound by the table length */
      if ( version != 0x00010000UL                    ||
           axis_size != 20                            ||
           num_axes == 0                              ||
           /* `num_axes' limit implied by 16-bit `instance_size' */
           num_axes > 0x3FFE                          ||
           !( instance_size == 4 + 4 * num_axes ||
              instance_size == 6 + 4 * num_axes )     ||
           /* `num_instances' limit implied by limited range of name IDs */
           num_instances > 0x7EFF                     ||
           offset                          +
             axis_size * num_axes          +
             instance_size * num_instances > fvar_len )
        num_instances = 0;
      else
        face->variation_support |= TT_FACE_FLAG_VAR_FVAR;

      /*
       *  As documented in the OpenType specification, an entry for the
       *  default instance may be omitted in the named instance table.  In
       *  particular this means that even if there is no named instance
       *  table in the font we actually do have a named instance, namely the
       *  default instance.
       *
       *  For consistency, we always want the default instance in our list
       *  of named instances.  If it is missing, we try to synthesize it
       *  later on.  Here, we have to adjust `num_instances' accordingly.
       */

      if ( ( face->variation_support & TT_FACE_FLAG_VAR_FVAR ) &&
           !( FT_ALLOC( default_values, num_axes * 4 )  ||
              FT_ALLOC( instance_values, num_axes * 4 ) )      )
      {
        /* the current stream position is 16 bytes after the table start */
        FT_ULong  array_start = FT_STREAM_POS() - 16 + offset;
        FT_ULong  default_value_offset, instance_offset;

        FT_Byte*  p;
        FT_UInt   i;


        default_value_offset = array_start + 8;
        p                    = default_values;

        for ( i = 0; i < num_axes; i++ )
        {
          (void)FT_STREAM_READ_AT( default_value_offset, p, 4 );

          default_value_offset += axis_size;
          p                    += 4;
        }

        instance_offset = array_start + axis_size * num_axes + 4;

        for ( i = 0; i < num_instances; i++ )
        {
          (void)FT_STREAM_READ_AT( instance_offset,
                                   instance_values,
                                   num_axes * 4 );

          if ( !ft_memcmp( default_values, instance_values, num_axes * 4 ) )
            break;

          instance_offset += instance_size;
        }

        if ( i == num_instances )
        {
          /* no default instance in named instance table; */
          /* we thus have to synthesize it                */
          num_instances++;
        }
      }

      FT_FREE( default_values );
      FT_FREE( instance_values );

      /* we don't support Multiple Master CFFs yet; */
      /* note that `glyf' or `CFF2' have precedence */
      if ( face->goto_table( face, TTAG_glyf, stream, 0 ) &&
           face->goto_table( face, TTAG_CFF2, stream, 0 ) &&
           !face->goto_table( face, TTAG_CFF, stream, 0 ) )
        num_instances = 0;

      /* instance indices in `face_instance_index' start with index 1, */
      /* thus `>' and not `>='                                         */
      if ( instance_index > num_instances )
      {
        if ( face_instance_index >= 0 )
          return FT_THROW( Invalid_Argument );
        else
          num_instances = 0;
      }

      face->root.style_flags = (FT_Long)num_instances << 16;
    }
#endif

    face->root.num_faces  = face->ttc_header.count;
    face->root.face_index = face_instance_index;

    return error;
  }